

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

int htmlParseChunk(htmlParserCtxtPtr ctxt,char *chunk,int size,int terminate)

{
  xmlChar *pxVar1;
  xmlChar *pxVar2;
  xmlParserInputBufferPtr input;
  int iVar3;
  size_t sVar4;
  size_t current;
  size_t base_1;
  int nbchars;
  xmlParserInputBufferPtr in;
  int res;
  size_t cur;
  size_t base;
  int terminate_local;
  int size_local;
  char *chunk_local;
  htmlParserCtxtPtr ctxt_local;
  
  if ((ctxt == (htmlParserCtxtPtr)0x0) || (ctxt->input == (xmlParserInputPtr)0x0)) {
    htmlParseErr(ctxt,XML_ERR_INTERNAL_ERROR,"htmlParseChunk: context error\n",(xmlChar *)0x0,
                 (xmlChar *)0x0);
    ctxt_local._4_4_ = 1;
  }
  else {
    if ((((size < 1) || (chunk == (char *)0x0)) || (ctxt->input == (xmlParserInputPtr)0x0)) ||
       ((ctxt->input->buf == (xmlParserInputBufferPtr)0x0 || (ctxt->instate == XML_PARSER_EOF)))) {
      if ((((ctxt->instate != XML_PARSER_EOF) &&
           ((ctxt->input != (xmlParserInputPtr)0x0 &&
            (ctxt->input->buf != (xmlParserInputBufferPtr)0x0)))) &&
          (input = ctxt->input->buf, input->encoder != (xmlCharEncodingHandlerPtr)0x0)) &&
         ((input->buffer != (xmlBufPtr)0x0 && (input->raw != (xmlBufPtr)0x0)))) {
        sVar4 = xmlBufGetInputBase(input->buffer,ctxt->input);
        pxVar1 = ctxt->input->cur;
        pxVar2 = ctxt->input->base;
        iVar3 = xmlCharEncInput(input,terminate);
        xmlBufSetInputBaseCur(input->buffer,ctxt->input,sVar4,(long)pxVar1 - (long)pxVar2);
        if (iVar3 < 0) {
          htmlParseErr(ctxt,XML_ERR_INVALID_ENCODING,"encoder error\n",(xmlChar *)0x0,(xmlChar *)0x0
                      );
          return 0x51;
        }
      }
    }
    else {
      sVar4 = xmlBufGetInputBase(ctxt->input->buf->buffer,ctxt->input);
      pxVar1 = ctxt->input->cur;
      pxVar2 = ctxt->input->base;
      iVar3 = xmlParserInputBufferPush(ctxt->input->buf,size,chunk);
      xmlBufSetInputBaseCur(ctxt->input->buf->buffer,ctxt->input,sVar4,(long)pxVar1 - (long)pxVar2);
      if (iVar3 < 0) {
        ctxt->errNo = -1;
        ctxt->disableSAX = 1;
        return -1;
      }
    }
    htmlParseTryOrFinish(ctxt,terminate);
    if (terminate != 0) {
      if (((ctxt->instate != XML_PARSER_EOF) && (ctxt->instate != XML_PARSER_EPILOG)) &&
         (ctxt->instate != XML_PARSER_MISC)) {
        ctxt->errNo = 5;
        ctxt->wellFormed = 0;
      }
      if (((ctxt->instate != XML_PARSER_EOF) && (ctxt->sax != (_xmlSAXHandler *)0x0)) &&
         (ctxt->sax->endDocument != (endDocumentSAXFunc)0x0)) {
        (*ctxt->sax->endDocument)(ctxt->userData);
      }
      ctxt->instate = XML_PARSER_EOF;
    }
    ctxt_local._4_4_ = ctxt->errNo;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
htmlParseChunk(htmlParserCtxtPtr ctxt, const char *chunk, int size,
              int terminate) {
    if ((ctxt == NULL) || (ctxt->input == NULL)) {
	htmlParseErr(ctxt, XML_ERR_INTERNAL_ERROR,
		     "htmlParseChunk: context error\n", NULL, NULL);
	return(XML_ERR_INTERNAL_ERROR);
    }
    if ((size > 0) && (chunk != NULL) && (ctxt->input != NULL) &&
        (ctxt->input->buf != NULL) && (ctxt->instate != XML_PARSER_EOF))  {
	size_t base = xmlBufGetInputBase(ctxt->input->buf->buffer, ctxt->input);
	size_t cur = ctxt->input->cur - ctxt->input->base;
	int res;

	res = xmlParserInputBufferPush(ctxt->input->buf, size, chunk);
        xmlBufSetInputBaseCur(ctxt->input->buf->buffer, ctxt->input, base, cur);
	if (res < 0) {
	    ctxt->errNo = XML_PARSER_EOF;
	    ctxt->disableSAX = 1;
	    return (XML_PARSER_EOF);
	}
#ifdef DEBUG_PUSH
	xmlGenericError(xmlGenericErrorContext, "HPP: pushed %d\n", size);
#endif

#if 0
	if ((terminate) || (ctxt->input->buf->buffer->use > 80))
	    htmlParseTryOrFinish(ctxt, terminate);
#endif
    } else if (ctxt->instate != XML_PARSER_EOF) {
	if ((ctxt->input != NULL) && ctxt->input->buf != NULL) {
	    xmlParserInputBufferPtr in = ctxt->input->buf;
	    if ((in->encoder != NULL) && (in->buffer != NULL) &&
		    (in->raw != NULL)) {
		int nbchars;
		size_t base = xmlBufGetInputBase(in->buffer, ctxt->input);
		size_t current = ctxt->input->cur - ctxt->input->base;

		nbchars = xmlCharEncInput(in, terminate);
		xmlBufSetInputBaseCur(in->buffer, ctxt->input, base, current);
		if (nbchars < 0) {
		    htmlParseErr(ctxt, XML_ERR_INVALID_ENCODING,
			         "encoder error\n", NULL, NULL);
		    return(XML_ERR_INVALID_ENCODING);
		}
	    }
	}
    }
    htmlParseTryOrFinish(ctxt, terminate);
    if (terminate) {
	if ((ctxt->instate != XML_PARSER_EOF) &&
	    (ctxt->instate != XML_PARSER_EPILOG) &&
	    (ctxt->instate != XML_PARSER_MISC)) {
	    ctxt->errNo = XML_ERR_DOCUMENT_END;
	    ctxt->wellFormed = 0;
	}
	if (ctxt->instate != XML_PARSER_EOF) {
	    if ((ctxt->sax) && (ctxt->sax->endDocument != NULL))
		ctxt->sax->endDocument(ctxt->userData);
	}
	ctxt->instate = XML_PARSER_EOF;
    }
    return((xmlParserErrors) ctxt->errNo);
}